

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void draw_uniques(int *array,size_t length,int min,int max)

{
  int iVar1;
  ulong local_30;
  size_t o;
  size_t n;
  int max_local;
  int min_local;
  size_t length_local;
  int *array_local;
  
  o = 0;
  do {
    if (length <= o) {
      return;
    }
    iVar1 = rand();
    array[o] = iVar1 % (max - min) + min;
    for (local_30 = 0; local_30 < o; local_30 = local_30 + 1) {
      if (array[local_30] == array[o]) {
        o = o - 1;
        break;
      }
    }
    o = o + 1;
  } while( true );
}

Assistant:

void draw_uniques(int* array, const size_t length, const int min, const int max) {
  for (size_t n = 0; n < length; n++) {
    array[n] = rand() % (max - min) + min;
    for (size_t o = 0; o < n; o++) {
      if (array[o] == array[n]) {
        // Decrement and loop over
        n--;
        break;
      }
    }
  }
}